

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseRightBoundary(DOMRangeImpl *this,DOMNode *root,int how)

{
  DOMNode *pDVar1;
  int iVar2;
  int iVar3;
  DOMNode *pDVar4;
  undefined4 extraout_var;
  DOMNode *pDVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bool isFullySelected;
  DOMNode *n;
  
  pDVar4 = getSelectedNode(this,this->fEndContainer,(int)this->fEndOffset + -1);
  isFullySelected = pDVar4 != this->fEndContainer;
  if (pDVar4 == root) {
    pDVar4 = traverseNode(this,pDVar4,pDVar4 != this->fEndContainer,false,how);
    return pDVar4;
  }
  iVar2 = (*pDVar4->_vptr_DOMNode[5])(pDVar4);
  n = (DOMNode *)CONCAT44(extraout_var,iVar2);
  pDVar5 = traverseNode(this,n,false,false,how);
  while( true ) {
    pDVar1 = pDVar5;
    if (n == (DOMNode *)0x0) {
      return (DOMNode *)0x0;
    }
    while (pDVar4 != (DOMNode *)0x0) {
      iVar2 = (*pDVar4->_vptr_DOMNode[9])(pDVar4);
      pDVar4 = traverseNode(this,pDVar4,isFullySelected,false,how);
      if (how != 3) {
        iVar3 = (*pDVar1->_vptr_DOMNode[7])(pDVar1);
        (*pDVar1->_vptr_DOMNode[0xe])(pDVar1,pDVar4,CONCAT44(extraout_var_01,iVar3));
      }
      isFullySelected = true;
      pDVar4 = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
    }
    if (n == root) break;
    iVar2 = (*n->_vptr_DOMNode[9])(n);
    pDVar4 = (DOMNode *)CONCAT44(extraout_var_02,iVar2);
    iVar2 = (*n->_vptr_DOMNode[5])(n);
    n = (DOMNode *)CONCAT44(extraout_var_03,iVar2);
    pDVar5 = traverseNode(this,n,false,false,how);
    if (how != 3) {
      (*pDVar5->_vptr_DOMNode[0x11])(pDVar5,pDVar1);
    }
  }
  return pDVar1;
}

Assistant:

DOMNode* DOMRangeImpl::traverseRightBoundary( DOMNode*root, int how )
{
    DOMNode*next = getSelectedNode( fEndContainer, (int)fEndOffset-1 );
    bool isFullySelected = ( next!=fEndContainer );

    if ( next==root )
        return traverseNode( next, isFullySelected, false, how );

    DOMNode*parent = next->getParentNode();
    DOMNode*clonedParent = traverseNode( parent, false, false, how );

    while( parent!=0 )
    {
        while( next!=0 )
        {
            DOMNode* prevSibling = next->getPreviousSibling();
            DOMNode* clonedChild =
                traverseNode( next, isFullySelected, false, how );
            if ( how!=DELETE_CONTENTS )
            {
                clonedParent->insertBefore(
                    clonedChild,
                    clonedParent->getFirstChild()
                );
            }
            isFullySelected = true;
            next = prevSibling;
        }
        if ( parent==root )
            return clonedParent;

        next = parent->getPreviousSibling();
        parent = parent->getParentNode();
        DOMNode* clonedGrandParent = traverseNode( parent, false, false, how );
        if ( how!=DELETE_CONTENTS )
            clonedGrandParent->appendChild( clonedParent );
        clonedParent = clonedGrandParent;

    }

    // should never occur
    return 0;
}